

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

ClassDeclarationSyntax * __thiscall slang::parsing::Parser::parseClass(Parser *this)

{
  bool bVar1;
  ClassDeclarationSyntax *pCVar2;
  AttrList attributes;
  Token local_28;
  
  attributes = parseAttributes(this);
  Token::Token(&local_28);
  bVar1 = ParserBase::peek(&this->super_ParserBase,VirtualKeyword);
  if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,InterfaceKeyword), bVar1)) {
    local_28 = ParserBase::consume(&this->super_ParserBase);
  }
  pCVar2 = parseClassDeclaration(this,attributes,local_28);
  return pCVar2;
}

Assistant:

ClassDeclarationSyntax& Parser::parseClass() {
    auto attributes = parseAttributes();

    Token virtualOrInterface;
    if (peek(TokenKind::VirtualKeyword) || peek(TokenKind::InterfaceKeyword))
        virtualOrInterface = consume();

    return parseClassDeclaration(attributes, virtualOrInterface);
}